

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pp_etc.c
# Opt level: O0

bool_t ppIsIrred(word *a,size_t n,void *stack)

{
  int iVar1;
  bool_t bVar2;
  word *a_00;
  size_t sVar3;
  ulong n_00;
  word *in_RDX;
  size_t in_RSI;
  word *in_RDI;
  word *d;
  word *h;
  size_t i;
  size_t in_stack_00000030;
  word *in_stack_00000038;
  word *in_stack_00000040;
  word *n_01;
  size_t in_stack_ffffffffffffffd8;
  word *a_01;
  bool_t local_4;
  
  n_01 = in_RDX + in_RSI;
  a_01 = n_01 + in_RSI;
  a_00 = (word *)wwWordSize(in_RDI,in_RSI);
  iVar1 = wwCmpW(a_01,in_stack_ffffffffffffffd8,(word)in_RDX);
  if (iVar1 < 1) {
    local_4 = 0;
  }
  else {
    wwSetW(in_RDX,(size_t)a_00,4);
    sVar3 = ppDeg(in_RDX,(size_t)n_01);
    for (n_00 = sVar3 >> 1; n_00 != 0; n_00 = n_00 - 1) {
      wwFlipBit(in_RDX,1);
      bVar2 = wwIsZero(in_RDX,(size_t)a_00);
      if (bVar2 != 0) {
        return 0;
      }
      ppGCD(in_stack_00000040,in_stack_00000038,in_stack_00000030,a,n,stack);
      iVar1 = wwCmpW(a_01,n_00,(word)in_RDX);
      if (iVar1 != 0) {
        return 0;
      }
      wwFlipBit(in_RDX,1);
      if (1 < n_00) {
        ppSqrMod(in_RDI,a_00,a_01,n_00,in_RDX);
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

bool_t ppIsIrred(const word a[], size_t n, void* stack)
{
	size_t i;
	word* h = (word*)stack;
	word* d = h + n;
	stack = d + n;
	// нормализация (нужна для \mod a)
	n = wwWordSize(a, n);
	// постоянный многочлен не является неприводимым
	if (wwCmpW(a, n, 1) <= 0)
		return FALSE;
	// h <- x^2
	wwSetW(h, n, 4);
	// основной цикл
	for (i = ppDeg(a, n) / 2; i; --i)
	{
		// (h + x, a) == 1?
		wwFlipBit(h, 1);
		if (wwIsZero(h, n))
			return FALSE;
		ppGCD(d, h, n, a, n, stack);
		if (wwCmpW(d, n, 1) != 0)
			return FALSE;
		wwFlipBit(h, 1);
		// h <- h^2 \mod a
		if (i > 1)
			ppSqrMod(h, h, a, n, stack);
	}
	return TRUE;
}